

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

char * cJSON_PrintBuffered(cJSON *item,int prebuffer,cJSON_bool fmt)

{
  cJSON_bool cVar1;
  uchar *puVar2;
  long in_FS_OFFSET;
  printbuffer p;
  printbuffer local_68;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.hooks.deallocate = (_func_void_void_ptr *)0x0;
  local_68.hooks.reallocate = (_func_void_ptr_void_ptr_size_t *)0x0;
  local_68.noalloc = 0;
  local_68.format = 0;
  local_68.hooks.allocate = (_func_void_ptr_size_t *)0x0;
  local_68.offset = 0;
  local_68.depth = 0;
  local_68.buffer = (uchar *)0x0;
  local_68.length = 0;
  if (-1 < prebuffer) {
    local_68.buffer = (uchar *)(*global_hooks.allocate)((ulong)(uint)prebuffer);
    if (local_68.buffer != (uchar *)0x0) {
      local_68.offset = 0;
      local_68._32_8_ = (ulong)(uint)fmt << 0x20;
      local_68.hooks.allocate = global_hooks.allocate;
      local_68.hooks.deallocate = global_hooks.deallocate;
      local_68.hooks.reallocate = global_hooks.reallocate;
      local_68.length = (ulong)(uint)prebuffer;
      cVar1 = print_value(item,&local_68);
      puVar2 = (uchar *)0x0;
      if (cVar1 != 0) {
        puVar2 = local_68.buffer;
      }
      goto LAB_00102a60;
    }
  }
  puVar2 = (uchar *)0x0;
LAB_00102a60:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (char *)puVar2;
  }
  __stack_chk_fail();
}

Assistant:

CJSON_PUBLIC(char *) cJSON_PrintBuffered(const cJSON *item, int prebuffer, cJSON_bool fmt)
{
    printbuffer p = { 0, 0, 0, 0, 0, 0, { 0, 0, 0 } };

    if (prebuffer < 0)
    {
        return NULL;
    }

    p.buffer = (unsigned char*)global_hooks.allocate((size_t)prebuffer);
    if (!p.buffer)
    {
        return NULL;
    }

    p.length = (size_t)prebuffer;
    p.offset = 0;
    p.noalloc = false;
    p.format = fmt;
    p.hooks = global_hooks;

    if (!print_value(item, &p))
    {
        return NULL;
    }

    return (char*)p.buffer;
}